

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
CommandDiagGetQuery(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)
::$_0::~__0(__0 *this)

{
  anon_class_80_4_75bccd57 *this_local;
  
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::function<void_(ot::commissioner::Error)>::~function
            ((function<void_(ot::commissioner::Error)> *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::CommandDiagGetQuery(const std::string &aAddr, uint64_t aDiagDataFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };
    CommandDiagGetQuery(wait, aAddr, aDiagDataFlags);
    return pro.get_future().get();
}